

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *ci;
  GCObject *pGVar1;
  char in_AL;
  uint uVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_138;
  char local_118 [64];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_138.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_138.overflow_arg_area = &argp[0].overflow_arg_area;
  local_138.gp_offset = 0x10;
  local_138.fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  pcVar3 = luaO_pushvfstring(L,fmt,&local_138);
  ci = L->ci;
  if ((ci->func->tt == 6) && ((((ci->func->value).gc)->h).flags == '\0')) {
    uVar2 = currentpc(L,ci);
    if ((int)uVar2 < 0) {
      uVar2 = 0xffffffff;
    }
    else {
      pGVar1 = ((((ci->func->value).gc)->th).l_G)->rootgc;
      if (pGVar1 == (GCObject *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(uint *)((long)pGVar1 + (ulong)uVar2 * 4);
      }
    }
    luaO_chunkid(local_118,(char *)&(((((ci->func->value).gc)->th).l_G)->grayagain->h).array,0x3c);
    luaO_pushfstring(L,"%s:%d: %s",local_118,(ulong)uVar2,pcVar3);
  }
  luaG_errormsg(L);
  return;
}

Assistant:

void luaG_runerror (lua_State *L, const char *fmt, ...) {
  va_list argp;
  va_start(argp, fmt);
  addinfo(L, luaO_pushvfstring(L, fmt, argp));
  va_end(argp);
  luaG_errormsg(L);
}